

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

void __thiscall
poplar::
map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_32UL>_>
::map(map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_32UL>_>
      *this,uint32_t capa_bits,uint64_t lambda)

{
  compact_fkhash_nlm<int,_32UL> cVar1;
  undefined8 *puVar2;
  uint32_t uVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  local_1a0;
  
  this->is_ready_ = false;
  this->lambda_ = 0x20;
  compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  ::compact_fkhash_trie(&this->hash_trie_);
  this->size_ = 0;
  this->num_codes_ = 0;
  auVar4 = ZEXT1664((undefined1  [16])0x0);
  cVar1 = (compact_fkhash_nlm<int,_32UL>)vmovdqu64_avx512f(auVar4);
  this->label_store_ = cVar1;
  auVar5 = vmovdqu64_avx512f(auVar4);
  *(undefined1 (*) [64])(this->codes_)._M_elems = auVar5;
  auVar5 = vmovdqu64_avx512f(auVar4);
  *(undefined1 (*) [64])((this->codes_)._M_elems + 0x40) = auVar5;
  auVar5 = vmovdqu64_avx512f(auVar4);
  *(undefined1 (*) [64])((this->codes_)._M_elems + 0x80) = auVar5;
  auVar5 = vmovdqu64_avx512f(auVar4);
  *(undefined1 (*) [64])((this->codes_)._M_elems + 0xc0) = auVar5;
  if ((int)POPCOUNT(lambda) == 1) {
    this->is_ready_ = true;
    this->lambda_ = lambda;
    uVar3 = 8;
    if (1 < lambda) {
      uVar3 = 0x48 - (int)LZCOUNT(lambda - 1);
    }
    auVar5 = ZEXT2464(ZEXT1624((undefined1  [16])0x0));
    compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
    ::compact_fkhash_trie(&local_1a0,capa_bits,uVar3,0);
    compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
    ::operator=(&this->hash_trie_,&local_1a0);
    compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
    ::~compact_fkhash_trie(&local_1a0);
    compact_fkhash_nlm<int,_32UL>::compact_fkhash_nlm
              ((compact_fkhash_nlm<int,_32UL> *)&local_1a0,(this->hash_trie_).capa_size_.bits_);
    compact_fkhash_nlm<int,_32UL>::operator=
              (&this->label_store_,(compact_fkhash_nlm<int,_32UL> *)&local_1a0);
    compact_fkhash_nlm<int,_32UL>::~compact_fkhash_nlm((compact_fkhash_nlm<int,_32UL> *)&local_1a0);
    auVar4 = vpternlogd_avx512f(auVar5,auVar5,auVar5,0xff);
    auVar5 = vmovdqu64_avx512f(auVar4);
    *(undefined1 (*) [64])(this->codes_)._M_elems = auVar5;
    auVar5 = vmovdqu64_avx512f(auVar4);
    *(undefined1 (*) [64])((this->codes_)._M_elems + 0xc0) = auVar5;
    auVar5 = vmovdqu64_avx512f(auVar4);
    *(undefined1 (*) [64])((this->codes_)._M_elems + 0x80) = auVar5;
    auVar5 = vmovdqu64_avx512f(auVar4);
    *(undefined1 (*) [64])((this->codes_)._M_elems + 0x40) = auVar5;
    uVar3 = this->num_codes_;
    this->num_codes_ = uVar3 + 1;
    (this->codes_)._M_elems[0] = (uchar)uVar3;
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = &PTR__exception_00189a50;
  puVar2[1] = 
  "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:57:lambda must be a power of 2."
  ;
  __cxa_throw(puVar2,&exception::typeinfo,std::exception::~exception);
}

Assistant:

explicit map(uint32_t capa_bits, uint64_t lambda = 32) {
        POPLAR_THROW_IF(!is_power2(lambda), "lambda must be a power of 2.");

        is_ready_ = true;
        lambda_ = lambda;
        hash_trie_ = Trie{capa_bits, 8 + bit_tools::ceil_log2(lambda_)};
        label_store_ = NLM{hash_trie_.capa_bits()};
        codes_.fill(UINT8_MAX);
        codes_[0] = static_cast<uint8_t>(num_codes_++);  // terminator
    }